

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_58494::ParserImpl::ParseMainExp(ParserImpl *this)

{
  int iVar1;
  TokenDetail *pTVar2;
  undefined8 uVar3;
  TokenDetail *in_RSI;
  tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_> in_RDI;
  ParseException *unaff_retaddr;
  ParserImpl *in_stack_00000018;
  PrefixExpType *in_stack_00000030;
  ParserImpl *in_stack_00000038;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *exp;
  TokenDetail *in_stack_ffffffffffffff78;
  ParserImpl *in_stack_ffffffffffffff80;
  ParserImpl *in_stack_ffffffffffffff88;
  unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *in_stack_ffffffffffffff90;
  _Head_base<0UL,_luna::SyntaxTree_*,_false> str;
  
  str._M_head_impl =
       (SyntaxTree *)
       in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
       super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
  std::unique_ptr<luna::SyntaxTree,std::default_delete<luna::SyntaxTree>>::
  unique_ptr<std::default_delete<luna::SyntaxTree>,void>
            ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
             in_stack_ffffffffffffff80);
  pTVar2 = LookAhead(in_stack_ffffffffffffff80);
  iVar1 = pTVar2->token_;
  if (iVar1 == 0x28) {
LAB_001d771b:
    ParsePrefixExp(in_stack_00000038,in_stack_00000030);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff80,
               (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff78);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
              (in_stack_ffffffffffffff90);
  }
  else {
    if (iVar1 == 0x7b) {
      ParseTableConstructor(in_stack_00000018);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff80,
                 (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                 in_stack_ffffffffffffff78);
      std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                (in_stack_ffffffffffffff90);
      return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
             in_RDI.
             super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
             super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
    }
    if (iVar1 != 0x106) {
      if (iVar1 == 0x108) {
        ParseFunctionDef(in_stack_ffffffffffffff88);
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::operator=
                  ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff80,
                   (unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
                   in_stack_ffffffffffffff78);
        std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::~unique_ptr
                  (in_stack_ffffffffffffff90);
        return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
               )(__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>
                 )in_RDI.
                  super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>
                  .super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
      }
      if ((iVar1 != 0x10c) && (iVar1 != 0x112)) {
        if (iVar1 == 0x115) goto LAB_001d771b;
        if ((1 < iVar1 - 0x116U) && (iVar1 != 0x11d)) {
          uVar3 = __cxa_allocate_exception(0x20);
          luna::ParseException::ParseException(unaff_retaddr,(char *)str._M_head_impl,in_RSI);
          __cxa_throw(uVar3,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
        }
      }
    }
    operator_new(0x30);
    NextToken(in_stack_ffffffffffffff80);
    luna::Terminator::Terminator((Terminator *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
    std::unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>::reset
              ((unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> *)
               in_stack_ffffffffffffff80,(pointer)in_stack_ffffffffffffff78);
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         in_RDI.super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseMainExp()
        {
            std::unique_ptr<SyntaxTree> exp;

            switch (LookAhead().token_)
            {
                case Token_Nil:
                case Token_False:
                case Token_True:
                case Token_Number:
                case Token_String:
                case Token_VarArg:
                    exp.reset(new Terminator(NextToken()));
                    break;

                case Token_Function:
                    exp = ParseFunctionDef();
                    break;

                case Token_Id:
                case '(':
                    exp = ParsePrefixExp();
                    break;

                case '{':
                    exp = ParseTableConstructor();
                    break;

                default:
                    throw ParseException("unexpect token for exp.", look_ahead_);
            }

            return exp;
        }